

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_opt_params *
ggml_opt_default_params(ggml_opt_params *__return_storage_ptr__,ggml_opt_type type)

{
  undefined1 auVar1 [32];
  ushort uStack_1e;
  
  if (type == GGML_OPT_LBFGS) {
    __return_storage_ptr__->type = GGML_OPT_LBFGS;
    __return_storage_ptr__->n_threads = 1;
    __return_storage_ptr__->past = 0;
    __return_storage_ptr__->delta = 1e-05;
    __return_storage_ptr__->max_no_improvement = 0;
    __return_storage_ptr__->print_forward_graph = true;
    __return_storage_ptr__->print_backward_graph = true;
    *(ulong *)&__return_storage_ptr__->field_0x16 = (ulong)uStack_1e;
    *(undefined8 *)((long)&(__return_storage_ptr__->adam).alpha + 2) = 0;
    (__return_storage_ptr__->adam).beta2 = 0.0;
    (__return_storage_ptr__->adam).eps = 0.0;
    (__return_storage_ptr__->adam).eps_f = 0.0;
    (__return_storage_ptr__->adam).eps_g = 0.0;
    (__return_storage_ptr__->lbfgs).m = 6;
    (__return_storage_ptr__->lbfgs).n_iter = 100;
    (__return_storage_ptr__->lbfgs).max_linesearch = 0x14;
    (__return_storage_ptr__->lbfgs).eps = 1e-05;
    (__return_storage_ptr__->lbfgs).ftol = 0.0001;
    (__return_storage_ptr__->lbfgs).wolfe = 0.9;
    (__return_storage_ptr__->lbfgs).min_step = 1e-20;
    (__return_storage_ptr__->lbfgs).max_step = 1e+20;
    (__return_storage_ptr__->lbfgs).linesearch = GGML_LINESEARCH_BACKTRACKING_WOLFE;
  }
  else if (type == GGML_OPT_ADAM) {
    __return_storage_ptr__->type = GGML_OPT_ADAM;
    __return_storage_ptr__->n_threads = 1;
    __return_storage_ptr__->past = 0;
    __return_storage_ptr__->delta = 1e-05;
    __return_storage_ptr__->max_no_improvement = 100;
    __return_storage_ptr__->print_forward_graph = true;
    __return_storage_ptr__->print_backward_graph = true;
    (__return_storage_ptr__->adam).n_iter = 10000;
    (__return_storage_ptr__->adam).alpha = 0.001;
    (__return_storage_ptr__->adam).beta1 = 0.9;
    (__return_storage_ptr__->adam).beta2 = 0.999;
    (__return_storage_ptr__->adam).eps = 1e-08;
    (__return_storage_ptr__->adam).eps_f = 1e-05;
    (__return_storage_ptr__->adam).eps_g = 0.001;
    auVar1 = ZEXT832(0) << 0x20;
    (__return_storage_ptr__->lbfgs).m = auVar1._0_4_;
    (__return_storage_ptr__->lbfgs).n_iter = auVar1._4_4_;
    (__return_storage_ptr__->lbfgs).max_linesearch = auVar1._8_4_;
    (__return_storage_ptr__->lbfgs).eps = (float)auVar1._12_4_;
    (__return_storage_ptr__->lbfgs).ftol = (float)auVar1._16_4_;
    (__return_storage_ptr__->lbfgs).wolfe = (float)auVar1._20_4_;
    (__return_storage_ptr__->lbfgs).min_step = (float)auVar1._24_4_;
    (__return_storage_ptr__->lbfgs).max_step = (float)auVar1._28_4_;
    (__return_storage_ptr__->lbfgs).linesearch = GGML_LINESEARCH_BACKTRACKING_ARMIJO;
    return __return_storage_ptr__;
  }
  return __return_storage_ptr__;
}

Assistant:

struct ggml_opt_params ggml_opt_default_params(enum ggml_opt_type type) {
    struct ggml_opt_params result;

    switch (type) {
        case GGML_OPT_ADAM:
            {
                result = (struct ggml_opt_params) {
                    .type      = GGML_OPT_ADAM,
                    .n_threads = 1,
                    .past      = 0,
                    .delta     = 1e-5f,

                    .max_no_improvement = 100,

                    .print_forward_graph  = true,
                    .print_backward_graph = true,

                    .adam = {
                        .n_iter = 10000,
                        .alpha  = 0.001f,
                        .beta1  = 0.9f,
                        .beta2  = 0.999f,
                        .eps    = 1e-8f,
                        .eps_f  = 1e-5f,
                        .eps_g  = 1e-3f,
                    },
                };
            } break;
        case GGML_OPT_LBFGS:
            {
                result = (struct ggml_opt_params) {
                    .type      = GGML_OPT_LBFGS,
                    .n_threads = 1,
                    .past      = 0,
                    .delta     = 1e-5f,

                    .max_no_improvement = 0,

                    .print_forward_graph  = true,
                    .print_backward_graph = true,

                    .lbfgs = {
                        .m              = 6,
                        .n_iter         = 100,
                        .max_linesearch = 20,

                        .eps      = 1e-5f,
                        .ftol     = 1e-4f,
                        .wolfe    = 0.9f,
                        .min_step = 1e-20f,
                        .max_step = 1e+20f,

                        .linesearch = GGML_LINESEARCH_DEFAULT,
                    },
                };
            } break;
    }

    return result;
}